

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sumsurface.cpp
# Opt level: O2

bool __thiscall
ON_SumSurface::GetBBox(ON_SumSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_BoundingBox *this_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  ON_SumSurface *pS;
  ON_BoundingBox bboxA;
  ON_3dPoint local_b0;
  ON_BoundingBox bboxB;
  ON_BoundingBox local_60;
  
  this_00 = &this->m_bbox;
  bVar2 = ON_BoundingBox::IsValid(this_00);
  if (!bVar2) {
    ON_BoundingBox::ON_BoundingBox(&bboxA);
    ON_BoundingBox::ON_BoundingBox(&bboxB);
    if (this->m_curve[0] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_60,&this->m_curve[0]->super_ON_Geometry);
      bboxA.m_max.y = local_60.m_max.y;
      bboxA.m_max.z = local_60.m_max.z;
      bboxA.m_min.z = local_60.m_min.z;
      bboxA.m_max.x = local_60.m_max.x;
      bboxA.m_min.x = local_60.m_min.x;
      bboxA.m_min.y = local_60.m_min.y;
    }
    if (this->m_curve[1] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_60,&this->m_curve[1]->super_ON_Geometry);
      bboxB.m_max.y = local_60.m_max.y;
      bboxB.m_max.z = local_60.m_max.z;
      bboxB.m_min.z = local_60.m_min.z;
      bboxB.m_max.x = local_60.m_max.x;
      bboxB.m_min.x = local_60.m_min.x;
      bboxB.m_min.y = local_60.m_min.y;
    }
    bVar2 = ON_BoundingBox::IsValid(&bboxA);
    if ((bVar2) && (bVar2 = ON_BoundingBox::IsValid(&bboxB), bVar2)) {
      ON_3dPoint::operator+(&local_b0,&bboxA.m_min,&bboxB.m_min);
      ON_3dPoint::operator+(&local_60.m_min,&local_b0,&this->m_basepoint);
      (this->m_bbox).m_min.z = local_60.m_min.z;
      (this_00->m_min).x = local_60.m_min.x;
      (this->m_bbox).m_min.y = local_60.m_min.y;
      ON_3dPoint::operator+(&local_b0,&bboxA.m_max,&bboxB.m_max);
      ON_3dPoint::operator+(&local_60.m_min,&local_b0,&this->m_basepoint);
      (this->m_bbox).m_max.z = local_60.m_min.z;
      (this->m_bbox).m_max.x = local_60.m_min.x;
      (this->m_bbox).m_max.y = local_60.m_min.y;
    }
    bVar2 = ON_BoundingBox::IsValid(this_00);
    if (!bVar2) {
      return false;
    }
  }
  iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
  ON_BoundingBox::ON_BoundingBox(&bboxA);
  if (boxmax == (double *)0x0 || (!bGrowBox || boxmin == (double *)0x0)) {
    bboxA.m_min.x = (this_00->m_min).x;
    bboxA.m_min.y = (this->m_bbox).m_min.y;
    bboxA.m_min.z = (this->m_bbox).m_min.z;
    bboxA.m_max.x = (this->m_bbox).m_max.x;
    bboxA.m_max.y = (this->m_bbox).m_max.y;
    bboxA.m_max.z = (this->m_bbox).m_max.z;
  }
  else {
    for (uVar6 = 0; (uVar6 < 3 && ((long)uVar6 < (long)iVar3)); uVar6 = uVar6 + 1) {
      dVar1 = boxmin[uVar6];
      pdVar4 = ON_3dPoint::operator[](&bboxA.m_min,(int)uVar6);
      *pdVar4 = dVar1;
      dVar1 = boxmax[uVar6];
      pdVar4 = ON_3dPoint::operator[](&bboxA.m_max,(int)uVar6);
      *pdVar4 = dVar1;
    }
    bVar2 = ON_BoundingBox::IsValid(&bboxA);
    if (bVar2) {
      ON_BoundingBox::Union(&bboxA,this_00);
    }
    else {
      bboxA.m_min.x = (this_00->m_min).x;
      bboxA.m_min.y = (this->m_bbox).m_min.y;
      bboxA.m_min.z = (this->m_bbox).m_min.z;
      bboxA.m_max.x = (this->m_bbox).m_max.x;
      bboxA.m_max.y = (this->m_bbox).m_max.y;
      bboxA.m_max.z = (this->m_bbox).m_max.z;
    }
  }
  iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
  for (uVar6 = 0; (uVar6 < 3 && ((long)uVar6 < (long)iVar3)); uVar6 = uVar6 + 1) {
    if (boxmin != (double *)0x0) {
      pdVar4 = ON_3dPoint::operator[](&bboxA.m_min,(int)uVar6);
      boxmin[uVar6] = *pdVar4;
    }
    if (boxmax != (double *)0x0) {
      pdVar4 = ON_3dPoint::operator[](&bboxA.m_max,(int)uVar6);
      boxmax[uVar6] = *pdVar4;
    }
  }
  for (lVar5 = 3; lVar5 < iVar3; lVar5 = lVar5 + 1) {
    if (boxmin != (double *)0x0) {
      boxmin[lVar5] = 0.0;
    }
    if (boxmax != (double *)0x0) {
      boxmax[lVar5] = 0.0;
    }
  }
  return true;
}

Assistant:

bool ON_SumSurface::GetBBox( // returns true if successful
       double* boxmin,    // boxmin[dim]
       double* boxmax,    // boxmax[dim]
       bool bGrowBox
       ) const
{
  bool rc = m_bbox.IsValid();
  if (!rc )
  {
    // lazy bounding box evaluation
    ON_BoundingBox bboxA, bboxB;
    if ( m_curve[0] )
      bboxA = m_curve[0]->BoundingBox();
    if ( m_curve[1] )
      bboxB = m_curve[1]->BoundingBox();
    if ( bboxA.IsValid() && bboxB.IsValid() )
    {
      ON_SumSurface* pS = const_cast<ON_SumSurface*>(this);
      pS->m_bbox.m_min = bboxA.m_min + bboxB.m_min + m_basepoint;
      pS->m_bbox.m_max = bboxA.m_max + bboxB.m_max + m_basepoint;
    }
    rc = m_bbox.IsValid();
  }

  if ( rc )
  {
    int dim = Dimension();
    int j;
    ON_BoundingBox bbox;
    if ( bGrowBox && boxmin && boxmax )
    {
      for ( j = 0; j < 3 && j < dim; j++ )
      {
        bbox.m_min[j] = boxmin[j];
        bbox.m_max[j] = boxmax[j];
      }
      if ( !bbox.IsValid() )
        bbox = m_bbox;
      else
        bbox.Union(m_bbox);
    }
    else
      bbox = m_bbox;
    dim = Dimension();
    for ( j = 0; j < 3 && j < dim; j++ )
    {
      if(boxmin) 
        boxmin[j] = bbox.m_min[j];
      if(boxmax) 
        boxmax[j] = bbox.m_max[j];
    }
    for ( j = 3; j < dim; j++ )
    {
      if (boxmin) 
        boxmin[j] = 0.0;
      if (boxmax) 
        boxmax[j] = 0.0;
    }
  }
  return rc;
}